

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeBroadcastLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  mapped_type *pmVar5;
  ShapeRange *pSVar6;
  size_t sVar7;
  RangeValue RVar8;
  bool local_26d;
  ShapeConstraint *inShape_1;
  undefined1 local_248 [4];
  int i_1;
  ShapeRange local_228;
  ShapeRange local_208;
  RangeValue local_1e8;
  RangeValue local_1d8;
  RangeValue local_1c8;
  ShapeRange local_1b8;
  ShapeRange local_198;
  mapped_type *local_178;
  ShapeConstraint *outputShape;
  size_t local_168;
  size_t local_160;
  size_t local_158;
  ShapeRange local_150;
  ShapeRange local_130;
  ShapeRange local_110;
  ShapeRange local_f0;
  mapped_type *local_d0;
  ShapeConstraint *inShape;
  int i;
  bool inputShapesFixed;
  ShapeRange maxWidth;
  ShapeRange maxHeight;
  ShapeRange maxChannel;
  ShapeRange maxBatch;
  ShapeRange maxSequence;
  ShapeConstraint *maxShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar4);
  pSVar6 = ShapeConstraint::sequenceRange(pmVar5);
  maxBatch._maximum._val = *(size_t *)&pSVar6->_minimum;
  pSVar6 = ShapeConstraint::batchRange(pmVar5);
  maxChannel._maximum._val = *(size_t *)&pSVar6->_minimum;
  maxBatch._minimum._0_8_ = (pSVar6->_minimum)._val;
  maxBatch._minimum._val = *(size_t *)&pSVar6->_maximum;
  maxBatch._maximum._0_8_ = (pSVar6->_maximum)._val;
  pSVar6 = ShapeConstraint::channelRange(pmVar5);
  maxHeight._maximum._val = *(size_t *)&pSVar6->_minimum;
  maxChannel._minimum._0_8_ = (pSVar6->_minimum)._val;
  maxChannel._minimum._val = *(size_t *)&pSVar6->_maximum;
  maxChannel._maximum._0_8_ = (pSVar6->_maximum)._val;
  pSVar6 = ShapeConstraint::heightRange(pmVar5);
  maxWidth._maximum._val = *(size_t *)&pSVar6->_minimum;
  maxHeight._minimum._0_8_ = (pSVar6->_minimum)._val;
  maxHeight._minimum._val = *(size_t *)&pSVar6->_maximum;
  maxHeight._maximum._0_8_ = (pSVar6->_maximum)._val;
  pSVar6 = ShapeConstraint::widthRange(pmVar5);
  _i = *(ShapeConstraint **)&pSVar6->_minimum;
  maxWidth._minimum._0_8_ = (pSVar6->_minimum)._val;
  maxWidth._minimum._val = *(size_t *)&pSVar6->_maximum;
  maxWidth._maximum._0_8_ = (pSVar6->_maximum)._val;
  inShape._7_1_ = ShapeConstraint::hasFixedCHW(pmVar5);
  inShape._0_4_ = 1;
  while( true ) {
    iVar3 = (int)inShape;
    iVar2 = Specification::NeuralNetworkLayer::input_size(specLayer);
    if (iVar2 <= iVar3) break;
    psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,(int)inShape);
    local_d0 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](&this->blobShapes,psVar4);
    local_26d = false;
    if ((inShape._7_1_ & 1) != 0) {
      local_26d = ShapeConstraint::hasFixedCHW(local_d0);
    }
    inShape._7_1_ = local_26d;
    pSVar6 = ShapeConstraint::sequenceRange(local_d0);
    ShapeRange::intersect(&local_f0,(ShapeRange *)&maxBatch._maximum._val,pSVar6);
    maxBatch._maximum._val = local_f0._minimum._0_8_;
    pSVar6 = ShapeConstraint::batchRange(local_d0);
    ShapeRange::intersect(&local_110,(ShapeRange *)&maxChannel._maximum._val,pSVar6);
    maxChannel._maximum._val = local_110._minimum._0_8_;
    maxBatch._minimum._0_8_ = local_110._minimum._val;
    maxBatch._minimum._val = local_110._maximum._0_8_;
    maxBatch._maximum._0_8_ = local_110._maximum._val;
    pSVar6 = ShapeConstraint::channelRange(local_d0);
    ShapeRange::unify(&local_130,(ShapeRange *)&maxHeight._maximum._val,pSVar6);
    maxHeight._maximum._val = local_130._minimum._0_8_;
    maxChannel._minimum._0_8_ = local_130._minimum._val;
    maxChannel._minimum._val = local_130._maximum._0_8_;
    maxChannel._maximum._0_8_ = local_130._maximum._val;
    pSVar6 = ShapeConstraint::heightRange(local_d0);
    ShapeRange::unify(&local_150,(ShapeRange *)&maxWidth._maximum._val,pSVar6);
    maxWidth._maximum._val = local_150._minimum._0_8_;
    maxHeight._minimum._0_8_ = local_150._minimum._val;
    maxHeight._minimum._val = local_150._maximum._0_8_;
    maxHeight._maximum._0_8_ = local_150._maximum._val;
    pSVar6 = ShapeConstraint::widthRange(local_d0);
    ShapeRange::unify((ShapeRange *)&outputShape,(ShapeRange *)&i,pSVar6);
    _i = outputShape;
    maxWidth._minimum._0_8_ = local_168;
    maxWidth._minimum._val = local_160;
    maxWidth._maximum._0_8_ = local_158;
    inShape._0_4_ = (int)inShape + 1;
  }
  psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar4);
  local_178 = pmVar5;
  psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(pmVar5,psVar4);
  pmVar5 = local_178;
  pSVar6 = ShapeConstraint::sequenceRange(local_178);
  ShapeRange::intersect(&local_198,pSVar6,(ShapeRange *)&maxBatch._maximum._val);
  ShapeConstraint::updateSequenceRange(pmVar5,&local_198);
  pmVar5 = local_178;
  pSVar6 = ShapeConstraint::batchRange(local_178);
  ShapeRange::intersect(&local_1b8,pSVar6,(ShapeRange *)&maxChannel._maximum._val);
  ShapeConstraint::updateBatchRange(pmVar5,&local_1b8);
  pmVar5 = local_178;
  if ((inShape._7_1_ & 1) == 0) {
    pSVar6 = ShapeConstraint::channelRange(local_178);
    ShapeRange::intersect(&local_208,pSVar6,(ShapeRange *)&maxHeight._maximum._val);
    ShapeConstraint::updateChannelRange(pmVar5,&local_208);
    pmVar5 = local_178;
    pSVar6 = ShapeConstraint::heightRange(local_178);
    ShapeRange::intersect(&local_228,pSVar6,(ShapeRange *)&maxWidth._maximum._val);
    ShapeConstraint::updateHeightRange(pmVar5,&local_228);
    pmVar5 = local_178;
    pSVar6 = ShapeConstraint::widthRange(local_178);
    ShapeRange::intersect((ShapeRange *)local_248,pSVar6,(ShapeRange *)&i);
    ShapeConstraint::updateWidthRange(pmVar5,(ShapeRange *)local_248);
  }
  else {
    RVar8 = ShapeRange::maximum((ShapeRange *)&maxHeight._maximum._val);
    local_1c8._val = RVar8._val;
    local_1c8._isUnbound = RVar8._isUnbound;
    sVar7 = RangeValue::value(&local_1c8);
    ShapeConstraint::setChannel(pmVar5,sVar7);
    pmVar5 = local_178;
    RVar8 = ShapeRange::maximum((ShapeRange *)&maxWidth._maximum._val);
    local_1d8._val = RVar8._val;
    local_1d8._isUnbound = RVar8._isUnbound;
    sVar7 = RangeValue::value(&local_1d8);
    ShapeConstraint::setHeight(pmVar5,sVar7);
    pmVar5 = local_178;
    RVar8 = ShapeRange::maximum((ShapeRange *)&i);
    local_1e8._val = RVar8._val;
    local_1e8._isUnbound = RVar8._isUnbound;
    sVar7 = RangeValue::value(&local_1e8);
    ShapeConstraint::setWidth(pmVar5,sVar7);
  }
  inShape_1._4_4_ = 0;
  while( true ) {
    iVar3 = Specification::NeuralNetworkLayer::input_size(specLayer);
    if (iVar3 <= inShape_1._4_4_) break;
    psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,inShape_1._4_4_);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](&this->blobShapes,psVar4);
    pSVar6 = ShapeConstraint::sequenceRange(local_178);
    ShapeConstraint::updateSequenceRange(pmVar5,pSVar6);
    pSVar6 = ShapeConstraint::batchRange(local_178);
    ShapeConstraint::updateBatchRange(pmVar5,pSVar6);
    bVar1 = ShapeConstraint::hasFixedCHW(pmVar5);
    if (!bVar1) {
      pSVar6 = ShapeConstraint::channelRange(local_178);
      ShapeConstraint::updateChannelRange(pmVar5,pSVar6);
      pSVar6 = ShapeConstraint::heightRange(local_178);
      ShapeConstraint::updateHeightRange(pmVar5,pSVar6);
      pSVar6 = ShapeConstraint::widthRange(local_178);
      ShapeConstraint::updateWidthRange(pmVar5,pSVar6);
    }
    inShape_1._4_4_ = inShape_1._4_4_ + 1;
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeBroadcastLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& maxShape = blobShapes[specLayer.input(0)];

    ShapeRange maxSequence = maxShape.sequenceRange();
    ShapeRange maxBatch = maxShape.batchRange();
    ShapeRange maxChannel = maxShape.channelRange();
    ShapeRange maxHeight = maxShape.heightRange();
    ShapeRange maxWidth = maxShape.widthRange();

    bool inputShapesFixed = maxShape.hasFixedCHW();

    for (int i = 1; i < specLayer.input_size(); i++) {

        ShapeConstraint& inShape = blobShapes[specLayer.input(i)];

        inputShapesFixed = inputShapesFixed && inShape.hasFixedCHW();

        maxSequence = maxSequence.intersect(inShape.sequenceRange());
        maxBatch = maxBatch.intersect(inShape.batchRange());

        maxChannel = maxChannel.unify(inShape.channelRange());
        maxHeight = maxHeight.unify(inShape.heightRange());
        maxWidth = maxWidth.unify(inShape.widthRange());

    }

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Broadcast layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Broadcast layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // Can there be ambiguity in the output of one of these? Yes.

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(maxSequence));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(maxBatch));

    if (inputShapesFixed) {
        outputShape.setChannel(maxChannel.maximum().value());
        outputShape.setHeight(maxHeight.maximum().value());
        outputShape.setWidth(maxWidth.maximum().value());
    }
    else {
        outputShape.updateChannelRange(outputShape.channelRange().intersect(maxChannel));
        outputShape.updateHeightRange(outputShape.heightRange().intersect(maxHeight));
        outputShape.updateWidthRange(outputShape.widthRange().intersect(maxWidth));
    }

    for (int i = 0; i < specLayer.input_size(); i++) {

        ShapeConstraint& inShape = blobShapes[specLayer.input(i)];
        inShape.updateSequenceRange(outputShape.sequenceRange());
        inShape.updateBatchRange(outputShape.batchRange());

        // Load constant followed by broadcast is a common pattern. If one of the inputs was from a
        // load constant layer, it will have a fixed shape, so we don't need to update shape information
        // in this case.

        if (!inShape.hasFixedCHW()) {
            inShape.updateChannelRange(outputShape.channelRange());
            inShape.updateHeightRange(outputShape.heightRange());
            inShape.updateWidthRange(outputShape.widthRange());
        }

    }


#if COREML_VALIDATOR_VERBOSE
    std::cout << "Broadcast layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Broadcast layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}